

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

void learn(svm_params *params,single_learner *param_2,example *ec)

{
  svm_model *psVar1;
  svm_example *this;
  flat_example *__src;
  svm_example *psVar2;
  ostream *poVar3;
  size_t sVar4;
  byte bVar5;
  int iVar6;
  vw *pvVar7;
  size_t i;
  size_t sVar8;
  float fVar9;
  float score;
  svm_example *sec;
  
  __src = flatten_sort_example(params->all,ec);
  if (__src != (flat_example *)0x0) {
    psVar2 = calloc_or_throw<svm_example>();
    sec = psVar2;
    memcpy(&psVar2->ex,__src,200);
    free(__src);
    score = 0.0;
    predict(params,&sec,&score,1);
    (ec->pred).scalar = score;
    fVar9 = 1.0 - score * (ec->l).simple.label;
    if (fVar9 <= 0.0) {
      fVar9 = 0.0;
    }
    ec->loss = fVar9;
    params->loss_sum = fVar9 + params->loss_sum;
    pvVar7 = params->all;
    bVar5 = pvVar7->training;
    if ((bool)bVar5 == true) {
      if (ec->example_counter % 100 == 0) {
        iVar6 = (int)params->maxcache;
        psVar1 = params->model;
        sVar4 = psVar1->num_support;
        for (sVar8 = 0; sVar4 != sVar8; sVar8 = sVar8 + 1) {
          this = (psVar1->support_vec)._begin[sVar8];
          iVar6 = iVar6 - (int)((ulong)((long)(this->krow)._end - (long)(this->krow)._begin) >> 2);
          if (iVar6 < 0) {
            svm_example::clear_kernels(this);
          }
        }
        pvVar7 = params->all;
        bVar5 = pvVar7->training;
      }
    }
    if ((((bVar5 & 1) != 0) && (1 < ec->example_counter)) && (ec->example_counter % 1000 == 0)) {
      poVar3 = std::operator<<(&(pvVar7->trace_message).super_ostream,"Number of support vectors = "
                              );
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<(&(params->all->trace_message).super_ostream,
                               "Number of kernel evaluations = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,"Number of cache queries = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," loss sum = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,params->loss_sum);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(params->model->alpha)._begin[params->model->num_support - 1]);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(params->model->alpha)._begin[params->model->num_support - 2]);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    params->pool[params->pool_pos] = psVar2;
    sVar4 = params->pool_pos + 1;
    params->pool_pos = sVar4;
    if (sVar4 == params->pool_size) {
      train(params);
      params->pool_pos = 0;
    }
  }
  return;
}

Assistant:

void learn(svm_params& params, single_learner&, example& ec)
{
  flat_example* fec = flatten_sort_example(*(params.all), &ec);
  if (fec)
  {
    svm_example* sec = &calloc_or_throw<svm_example>();
    sec->init_svm_example(fec);
    float score = 0;
    predict(params, &sec, &score, 1);
    ec.pred.scalar = score;
    // cout<<"Score = "<<score<<endl;
    ec.loss = max(0.f, 1.f - score * ec.l.simple.label);
    params.loss_sum += ec.loss;
    if (params.all->training && ec.example_counter % 100 == 0)
      trim_cache(params);
    if (params.all->training && ec.example_counter % 1000 == 0 && ec.example_counter >= 2)
    {
      params.all->trace_message << "Number of support vectors = " << params.model->num_support << endl;
      params.all->trace_message << "Number of kernel evaluations = " << num_kernel_evals << " "
                                << "Number of cache queries = " << num_cache_evals << " loss sum = " << params.loss_sum
                                << " " << params.model->alpha[params.model->num_support - 1] << " "
                                << params.model->alpha[params.model->num_support - 2] << endl;
    }
    params.pool[params.pool_pos] = sec;
    params.pool_pos++;

    if (params.pool_pos == params.pool_size)
    {
      train(params);
      params.pool_pos = 0;
    }
  }
}